

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void TTD::SnapShot::InitializeForSnapshotCompare
               (SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  SnapContext *pSVar1;
  FunctionBodyResolveInfo *pFVar2;
  UnorderedArrayListLink *pUVar3;
  UnorderedArrayListLink *pUVar4;
  UnorderedArrayListLink *pUVar5;
  UnorderedArrayListLink *pUVar6;
  UnorderedArrayListLink *pUVar7;
  UnorderedArrayListLink *pUVar8;
  UnorderedArrayListLink *pUVar9;
  UnorderedArrayListLink *pUVar10;
  UnorderedArrayListLink *pUVar11;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  UnorderedArrayListLink *pUVar14;
  SnapContext *pSVar15;
  FunctionBodyResolveInfo *pFVar16;
  long lVar17;
  FunctionBodyResolveInfo *pFVar18;
  uint32 i;
  ulong uVar19;
  SnapContext *local_58;
  FunctionBodyResolveInfo *local_38;
  
  local_58 = (snap1->m_ctxList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (snap1->m_ctxList).m_inlineHeadBlock.BlockData;
  pUVar9 = &(snap1->m_ctxList).m_inlineHeadBlock;
  pSVar15 = (SnapContext *)0x0;
  if (pSVar1 != local_58) {
    pSVar15 = pSVar1;
  }
  do {
    pUVar4 = pUVar9->Next;
    do {
      do {
        pUVar9 = pUVar4;
        if (pSVar15 == (SnapContext *)0x0) {
          local_58 = (snap2->m_ctxList).m_inlineHeadBlock.CurrPos;
          pSVar1 = (snap2->m_ctxList).m_inlineHeadBlock.BlockData;
          pUVar9 = &(snap2->m_ctxList).m_inlineHeadBlock;
          pSVar15 = (SnapContext *)0x0;
          if (pSVar1 != local_58) {
            pSVar15 = pSVar1;
          }
          do {
            pUVar4 = pUVar9->Next;
            do {
              do {
                pUVar9 = pUVar4;
                if (pSVar15 == (SnapContext *)0x0) {
                  pFVar16 = (FunctionBodyResolveInfo *)
                            (snap1->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
                  pFVar2 = (FunctionBodyResolveInfo *)
                           (snap1->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
                  pUVar10 = &(snap1->m_primitiveObjectList).m_inlineHeadBlock;
                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                  if (pFVar2 != pFVar16) {
                    pFVar18 = pFVar2;
                  }
                  do {
                    pUVar5 = pUVar10->Next;
                    do {
                      do {
                        pUVar10 = pUVar5;
                        if (pFVar18 == (FunctionBodyResolveInfo *)0x0) {
                          pFVar16 = (FunctionBodyResolveInfo *)
                                    (snap2->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
                          pFVar2 = (FunctionBodyResolveInfo *)
                                   (snap2->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
                          pUVar10 = &(snap2->m_primitiveObjectList).m_inlineHeadBlock;
                          pFVar18 = (FunctionBodyResolveInfo *)0x0;
                          if (pFVar2 != pFVar16) {
                            pFVar18 = pFVar2;
                          }
                          do {
                            pUVar5 = pUVar10->Next;
                            do {
                              do {
                                pUVar10 = pUVar5;
                                if (pFVar18 == (FunctionBodyResolveInfo *)0x0) {
                                  pFVar16 = (FunctionBodyResolveInfo *)
                                            (snap1->m_slotArrayEntries).m_inlineHeadBlock.CurrPos;
                                  pFVar2 = (FunctionBodyResolveInfo *)
                                           (snap1->m_slotArrayEntries).m_inlineHeadBlock.BlockData;
                                  pUVar11 = &(snap1->m_slotArrayEntries).m_inlineHeadBlock;
                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                  if (pFVar2 != pFVar16) {
                                    pFVar18 = pFVar2;
                                  }
                                  do {
                                    pUVar6 = pUVar11->Next;
                                    do {
                                      do {
                                        pUVar11 = pUVar6;
                                        if (pFVar18 == (FunctionBodyResolveInfo *)0x0) {
                                          pFVar16 = (FunctionBodyResolveInfo *)
                                                    (snap2->m_slotArrayEntries).m_inlineHeadBlock.
                                                    CurrPos;
                                          pFVar2 = (FunctionBodyResolveInfo *)
                                                   (snap2->m_slotArrayEntries).m_inlineHeadBlock.
                                                   BlockData;
                                          pUVar11 = &(snap2->m_slotArrayEntries).m_inlineHeadBlock;
                                          pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                          if (pFVar2 != pFVar16) {
                                            pFVar18 = pFVar2;
                                          }
                                          do {
                                            pUVar6 = pUVar11->Next;
                                            do {
                                              do {
                                                pUVar11 = pUVar6;
                                                if (pFVar18 == (FunctionBodyResolveInfo *)0x0) {
                                                  pFVar16 = (FunctionBodyResolveInfo *)
                                                            (snap1->m_scopeEntries).
                                                            m_inlineHeadBlock.CurrPos;
                                                  pFVar2 = (FunctionBodyResolveInfo *)
                                                           (snap1->m_scopeEntries).m_inlineHeadBlock
                                                           .BlockData;
                                                  pUVar12 = &(snap1->m_scopeEntries).
                                                             m_inlineHeadBlock;
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  if (pFVar2 != pFVar16) {
                                                    pFVar18 = pFVar2;
                                                  }
                                                  do {
                                                    pUVar7 = pUVar12->Next;
                                                    do {
                                                      do {
                                                        pUVar12 = pUVar7;
                                                        if (pFVar18 ==
                                                            (FunctionBodyResolveInfo *)0x0) {
                                                          pFVar16 = (FunctionBodyResolveInfo *)
                                                                    (snap2->m_scopeEntries).
                                                                    m_inlineHeadBlock.CurrPos;
                                                          pFVar2 = (FunctionBodyResolveInfo *)
                                                                   (snap2->m_scopeEntries).
                                                                   m_inlineHeadBlock.BlockData;
                                                          pUVar12 = &(snap2->m_scopeEntries).
                                                                     m_inlineHeadBlock;
                                                          pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                          if (pFVar2 != pFVar16) {
                                                            pFVar18 = pFVar2;
                                                          }
                                                          do {
                                                            pUVar7 = pUVar12->Next;
                                                            do {
                                                              do {
                                                                pUVar12 = pUVar7;
                                                                if (pFVar18 ==
                                                                    (FunctionBodyResolveInfo *)0x0)
                                                                {
                                                                  pFVar16 = (snap1->
                                                  m_functionBodyList).m_inlineHeadBlock.CurrPos;
                                                  pFVar2 = (snap1->m_functionBodyList).
                                                           m_inlineHeadBlock.BlockData;
                                                  pUVar13 = &(snap1->m_functionBodyList).
                                                             m_inlineHeadBlock;
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  if (pFVar2 != pFVar16) {
                                                    pFVar18 = pFVar2;
                                                  }
                                                  do {
                                                    pUVar8 = pUVar13->Next;
                                                    do {
                                                      do {
                                                        pUVar13 = pUVar8;
                                                        if (pFVar18 ==
                                                            (FunctionBodyResolveInfo *)0x0) {
                                                          pFVar16 = (snap2->m_functionBodyList).
                                                                    m_inlineHeadBlock.CurrPos;
                                                          pFVar2 = (snap2->m_functionBodyList).
                                                                   m_inlineHeadBlock.BlockData;
                                                          pUVar13 = &(snap2->m_functionBodyList).
                                                                     m_inlineHeadBlock;
                                                          pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                          if (pFVar2 != pFVar16) {
                                                            pFVar18 = pFVar2;
                                                          }
                                                          do {
                                                            pUVar8 = pUVar13->Next;
                                                            do {
                                                              do {
                                                                pUVar13 = pUVar8;
                                                                if (pFVar18 ==
                                                                    (FunctionBodyResolveInfo *)0x0)
                                                                {
                                                                  pFVar16 = (FunctionBodyResolveInfo
                                                                             *)(snap1->
                                                  m_compoundObjectList).m_inlineHeadBlock.CurrPos;
                                                  pFVar2 = (FunctionBodyResolveInfo *)
                                                           (snap1->m_compoundObjectList).
                                                           m_inlineHeadBlock.BlockData;
                                                  pUVar14 = &(snap1->m_compoundObjectList).
                                                             m_inlineHeadBlock;
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  if (pFVar2 != pFVar16) {
                                                    pFVar18 = pFVar2;
                                                  }
                                                  do {
                                                    pUVar3 = pUVar14->Next;
                                                    do {
                                                      do {
                                                        pUVar14 = pUVar3;
                                                        if (pFVar18 ==
                                                            (FunctionBodyResolveInfo *)0x0) {
                                                          pFVar16 = (FunctionBodyResolveInfo *)
                                                                    (snap2->m_compoundObjectList).
                                                                    m_inlineHeadBlock.CurrPos;
                                                          pFVar2 = (FunctionBodyResolveInfo *)
                                                                   (snap2->m_compoundObjectList).
                                                                   m_inlineHeadBlock.BlockData;
                                                          pUVar14 = &(snap2->m_compoundObjectList).
                                                                     m_inlineHeadBlock;
                                                          pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                          if (pFVar2 != pFVar16) {
                                                            pFVar18 = pFVar2;
                                                          }
                                                          do {
                                                            pUVar3 = pUVar14->Next;
                                                            do {
                                                              do {
                                                                pUVar14 = pUVar3;
                                                                if (pFVar18 ==
                                                                    (FunctionBodyResolveInfo *)0x0)
                                                                {
                                                                  return;
                                                                }
                                                                local_38 = pFVar18;
                                                                JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H2ObjectMap,
                                                  &pFVar18->FunctionBodyId,(SnapObject **)&local_38)
                                                  ;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            &(pFVar18->ScopeChainInfo).ScopeArray;
                                                  pUVar3 = pUVar14;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar3 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar14 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = (FunctionBodyResolveInfo *)
                                                            pUVar14->CurrPos;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            pUVar14->BlockData;
                                                  } while( true );
                                                  }
                                                  local_38 = pFVar18;
                                                  JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H1ObjectMap,
                                                  &pFVar18->FunctionBodyId,(SnapObject **)&local_38)
                                                  ;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            &(pFVar18->ScopeChainInfo).ScopeArray;
                                                  pUVar3 = pUVar14;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar3 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar14 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = (FunctionBodyResolveInfo *)
                                                            pUVar14->CurrPos;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            pUVar14->BlockData;
                                                  } while( true );
                                                  }
                                                  local_38 = pFVar18;
                                                  JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H2FunctionBodyMap,
                                                  &pFVar18->FunctionBodyId,&local_38);
                                                  pFVar18 = pFVar18 + 1;
                                                  pUVar8 = pUVar13;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar8 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar13 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = pUVar13->CurrPos;
                                                  pFVar18 = pUVar13->BlockData;
                                                  } while( true );
                                                  }
                                                  local_38 = pFVar18;
                                                  JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H1FunctionBodyMap,
                                                  &pFVar18->FunctionBodyId,&local_38);
                                                  pFVar18 = pFVar18 + 1;
                                                  pUVar8 = pUVar13;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar8 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar13 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = pUVar13->CurrPos;
                                                  pFVar18 = pUVar13->BlockData;
                                                  } while( true );
                                                  }
                                                  local_38 = pFVar18;
                                                  JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H2FunctionScopeInfoMap,
                                                  &pFVar18->FunctionBodyId,
                                                  (ScriptFunctionScopeInfo **)&local_38);
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            &pFVar18->OptKnownPath;
                                                  pUVar7 = pUVar12;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar7 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar12 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = (FunctionBodyResolveInfo *)
                                                            pUVar12->CurrPos;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            pUVar12->BlockData;
                                                  } while( true );
                                                  }
                                                  local_38 = pFVar18;
                                                  JsUtil::
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                            ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H1FunctionScopeInfoMap,
                                                  &pFVar18->FunctionBodyId,
                                                  (ScriptFunctionScopeInfo **)&local_38);
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            &pFVar18->OptKnownPath;
                                                  pUVar7 = pUVar12;
                                                  } while (pFVar18 != pFVar16);
                                                  pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                                  pUVar7 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar12 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pFVar16 = (FunctionBodyResolveInfo *)
                                                            pUVar12->CurrPos;
                                                  pFVar18 = (FunctionBodyResolveInfo *)
                                                            pUVar12->BlockData;
                                                  } while( true );
                                                }
                                                local_38 = pFVar18;
                                                JsUtil::
                                                BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                ::
                                                Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                          ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H2SlotArrayMap,
                                                  &pFVar18->FunctionBodyId,
                                                  (SlotArrayInfo **)&local_38);
                                                pFVar18 = (FunctionBodyResolveInfo *)
                                                          &(pFVar18->ScopeChainInfo).ScopeArray;
                                                pUVar6 = pUVar11;
                                              } while (pFVar18 != pFVar16);
                                              pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                              pUVar6 = (UnorderedArrayListLink *)0x0;
                                            } while (pUVar11 == (UnorderedArrayListLink *)0x0);
                                            pFVar16 = (FunctionBodyResolveInfo *)pUVar11->CurrPos;
                                            pFVar18 = (FunctionBodyResolveInfo *)pUVar11->BlockData;
                                          } while( true );
                                        }
                                        local_38 = pFVar18;
                                        JsUtil::
                                        BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                        ::
                                        Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                                  ((
                                                  BaseDictionary<unsigned_long,TTD::NSSnapValues::SlotArrayInfo_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)&compareMap->H1SlotArrayMap,
                                                  &pFVar18->FunctionBodyId,
                                                  (SlotArrayInfo **)&local_38);
                                        pFVar18 = (FunctionBodyResolveInfo *)
                                                  &(pFVar18->ScopeChainInfo).ScopeArray;
                                        pUVar6 = pUVar11;
                                      } while (pFVar18 != pFVar16);
                                      pFVar18 = (FunctionBodyResolveInfo *)0x0;
                                      pUVar6 = (UnorderedArrayListLink *)0x0;
                                    } while (pUVar11 == (UnorderedArrayListLink *)0x0);
                                    pFVar16 = (FunctionBodyResolveInfo *)pUVar11->CurrPos;
                                    pFVar18 = (FunctionBodyResolveInfo *)pUVar11->BlockData;
                                  } while( true );
                                }
                                local_38 = pFVar18;
                                JsUtil::
                                BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                ::
                                Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                          ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                            *)&compareMap->H2ValueMap,&pFVar18->FunctionBodyId,
                                           (SnapPrimitiveValue **)&local_38);
                                pFVar18 = (FunctionBodyResolveInfo *)&pFVar18->OptKnownPath;
                                pUVar5 = pUVar10;
                              } while (pFVar18 != pFVar16);
                              pFVar18 = (FunctionBodyResolveInfo *)0x0;
                              pUVar5 = (UnorderedArrayListLink *)0x0;
                            } while (pUVar10 == (UnorderedArrayListLink *)0x0);
                            pFVar16 = (FunctionBodyResolveInfo *)pUVar10->CurrPos;
                            pFVar18 = (FunctionBodyResolveInfo *)pUVar10->BlockData;
                          } while( true );
                        }
                        local_38 = pFVar18;
                        JsUtil::
                        BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        ::
                        Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                  ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapPrimitiveValue_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                    *)&compareMap->H1ValueMap,&pFVar18->FunctionBodyId,
                                   (SnapPrimitiveValue **)&local_38);
                        pFVar18 = (FunctionBodyResolveInfo *)&pFVar18->OptKnownPath;
                        pUVar5 = pUVar10;
                      } while (pFVar18 != pFVar16);
                      pFVar18 = (FunctionBodyResolveInfo *)0x0;
                      pUVar5 = (UnorderedArrayListLink *)0x0;
                    } while (pUVar10 == (UnorderedArrayListLink *)0x0);
                    pFVar16 = (FunctionBodyResolveInfo *)pUVar10->CurrPos;
                    pFVar18 = (FunctionBodyResolveInfo *)pUVar10->BlockData;
                  } while( true );
                }
                lVar17 = 8;
                for (uVar19 = 0; uVar19 < pSVar15->LoadedTopLevelScriptCount; uVar19 = uVar19 + 1) {
                  local_38 = (FunctionBodyResolveInfo *)
                             (ulong)*(uint *)((long)pSVar15->LoadedTopLevelScriptArray + lVar17 + -8
                                             );
                  JsUtil::
                  BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)&compareMap->H2FunctionTopLevelLoadMap,
                             (unsigned_long *)
                             ((long)&pSVar15->LoadedTopLevelScriptArray->TopLevelBodyCtr + lVar17),
                             (unsigned_long *)&local_38);
                  lVar17 = lVar17 + 0x10;
                }
                lVar17 = 8;
                for (uVar19 = 0; uVar19 < pSVar15->NewFunctionTopLevelScriptCount;
                    uVar19 = uVar19 + 1) {
                  local_38 = (FunctionBodyResolveInfo *)
                             (ulong)*(uint *)((long)pSVar15->NewFunctionTopLevelScriptArray +
                                             lVar17 + -8);
                  JsUtil::
                  BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)&compareMap->H2FunctionTopLevelNewMap,
                             (unsigned_long *)
                             ((long)&pSVar15->NewFunctionTopLevelScriptArray->TopLevelBodyCtr +
                             lVar17),(unsigned_long *)&local_38);
                  lVar17 = lVar17 + 0x10;
                }
                lVar17 = 8;
                for (uVar19 = 0; uVar19 < pSVar15->EvalTopLevelScriptCount; uVar19 = uVar19 + 1) {
                  local_38 = (FunctionBodyResolveInfo *)
                             (ulong)*(uint *)((long)pSVar15->EvalTopLevelScriptArray + lVar17 + -8);
                  JsUtil::
                  BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)&compareMap->H2FunctionTopLevelEvalMap,
                             (unsigned_long *)
                             ((long)&pSVar15->EvalTopLevelScriptArray->TopLevelBodyCtr + lVar17),
                             (unsigned_long *)&local_38);
                  lVar17 = lVar17 + 0x10;
                }
                pSVar15 = pSVar15 + 1;
                pUVar4 = pUVar9;
              } while (pSVar15 != local_58);
              pSVar15 = (SnapContext *)0x0;
              pUVar4 = (UnorderedArrayListLink *)0x0;
            } while (pUVar9 == (UnorderedArrayListLink *)0x0);
            local_58 = pUVar9->CurrPos;
            pSVar15 = pUVar9->BlockData;
          } while( true );
        }
        lVar17 = 8;
        for (uVar19 = 0; uVar19 < pSVar15->LoadedTopLevelScriptCount; uVar19 = uVar19 + 1) {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar15->LoadedTopLevelScriptArray + lVar17 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelLoadMap,
                     (unsigned_long *)
                     ((long)&pSVar15->LoadedTopLevelScriptArray->TopLevelBodyCtr + lVar17),
                     (unsigned_long *)&local_38);
          lVar17 = lVar17 + 0x10;
        }
        lVar17 = 8;
        for (uVar19 = 0; uVar19 < pSVar15->NewFunctionTopLevelScriptCount; uVar19 = uVar19 + 1) {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar15->NewFunctionTopLevelScriptArray + lVar17 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelNewMap,
                     (unsigned_long *)
                     ((long)&pSVar15->NewFunctionTopLevelScriptArray->TopLevelBodyCtr + lVar17),
                     (unsigned_long *)&local_38);
          lVar17 = lVar17 + 0x10;
        }
        lVar17 = 8;
        for (uVar19 = 0; uVar19 < pSVar15->EvalTopLevelScriptCount; uVar19 = uVar19 + 1) {
          local_38 = (FunctionBodyResolveInfo *)
                     (ulong)*(uint *)((long)pSVar15->EvalTopLevelScriptArray + lVar17 + -8);
          JsUtil::
          BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&compareMap->H1FunctionTopLevelEvalMap,
                     (unsigned_long *)
                     ((long)&pSVar15->EvalTopLevelScriptArray->TopLevelBodyCtr + lVar17),
                     (unsigned_long *)&local_38);
          lVar17 = lVar17 + 0x10;
        }
        pSVar15 = pSVar15 + 1;
        pUVar4 = pUVar9;
      } while (pSVar15 != local_58);
      pSVar15 = (SnapContext *)0x0;
      pUVar4 = (UnorderedArrayListLink *)0x0;
    } while (pUVar9 == (UnorderedArrayListLink *)0x0);
    local_58 = pUVar9->CurrPos;
    pSVar15 = pUVar9->BlockData;
  } while( true );
}

Assistant:

void SnapShot::InitializeForSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        ////
        //Initialize all of the maps

        //top-level functions
        for(auto iter = snap1->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        for(auto iter = snap2->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        //Values and things
        for(auto iter = snap1->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap2->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap1->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap2->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap1->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        for(auto iter = snap2->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        //Bodies and objects
        for(auto iter = snap1->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap2->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap1->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }

        for(auto iter = snap2->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }
    }